

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::Link(DLevelScript *this)

{
  DLevelScript *pDVar1;
  DACSThinker *pointing;
  
  pointing = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  pDVar1 = pointing->Scripts;
  this->next = pDVar1;
  GC::WriteBarrier(&this->super_DObject,&pDVar1->super_DObject);
  pDVar1 = pointing->Scripts;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar1->prev = this;
    GC::WriteBarrier(&pDVar1->super_DObject,&this->super_DObject);
  }
  this->prev = (DLevelScript *)0x0;
  pointing->Scripts = this;
  GC::WriteBarrier((DObject *)pointing,&this->super_DObject);
  if (pointing->LastScript == (DLevelScript *)0x0) {
    pointing->LastScript = this;
  }
  return;
}

Assistant:

void DLevelScript::Link ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	next = controller->Scripts;
	GC::WriteBarrier(this, next);
	if (controller->Scripts)
	{
		controller->Scripts->prev = this;
		GC::WriteBarrier(controller->Scripts, this);
	}
	prev = NULL;
	controller->Scripts = this;
	GC::WriteBarrier(controller, this);
	if (controller->LastScript == NULL)
	{
		controller->LastScript = this;
	}
}